

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_decode.c
# Opt level: O2

void base64_decode_bs(BinarySink *bs,ptrlen input)

{
  BinarySink *bs_00;
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  BinarySource *src_00;
  size_t i;
  ulong uVar5;
  char b64atom [4];
  uchar binatom [3];
  BinarySource src [1];
  
  src[0].data = input.ptr;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  sVar3 = 0;
  sVar4 = input.len;
  src[0].len = sVar4;
  while (sVar4 != sVar3) {
    uVar5 = 0;
    src_00 = src[0].binarysource_;
    while (uVar5 < 4) {
      uVar1 = BinarySource_get_byte(src_00);
      src_00 = src[0].binarysource_;
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) {
        uVar1 = '=';
      }
      if ((uVar1 != '\n') && (uVar1 != '\r')) {
        b64atom[uVar5] = uVar1;
        uVar5 = uVar5 + 1;
      }
    }
    bs_00 = bs->binarysink_;
    iVar2 = base64_decode_atom(b64atom,binatom);
    BinarySink_put_data(bs_00,binatom,(long)iVar2);
    sVar3 = (src[0].binarysource_)->pos;
    sVar4 = (src[0].binarysource_)->len;
  }
  return;
}

Assistant:

void base64_decode_bs(BinarySink *bs, ptrlen input)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, input);

    while (get_avail(src)) {
        char b64atom[4];
        unsigned char binatom[3];

        for (size_t i = 0; i < 4 ;) {
            char c = get_byte(src);
            if (get_err(src))
                c = '=';
            if (c == '\n' || c == '\r')
                continue;
            b64atom[i++] = c;
        }

        put_data(bs, binatom, base64_decode_atom(b64atom, binatom));
    }
}